

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O2

SmodelsOutput * __thiscall
Potassco::SmodelsOutput::add(SmodelsOutput *this,Weight_t bnd,WeightLitSpan *lits,bool card)

{
  ostream *poVar1;
  uint i;
  uint i_00;
  WeightLit_t *pWVar2;
  ostream *poVar3;
  int iVar4;
  Weight_t *pWVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  
  pWVar2 = lits->first;
  uVar6 = 0;
  for (lVar7 = lits->size * 8; lVar7 != 0; lVar7 = lVar7 + -8) {
    iVar11 = -pWVar2->lit;
    if (-1 < pWVar2->weight) {
      iVar11 = pWVar2->lit;
    }
    uVar6 = uVar6 - (iVar11 >> 0x1f);
    pWVar2 = pWVar2 + 1;
  }
  uVar8 = (uint)lits->size;
  uVar10 = bnd;
  i = uVar8;
  i_00 = uVar6;
  if (!card) {
    uVar10 = uVar6;
    i = bnd;
    i_00 = uVar8;
  }
  add(this,i);
  add(this,i_00);
  add(this,uVar10);
  poVar1 = this->os_;
  pWVar2 = lits->first;
  uVar10 = uVar6;
  while (uVar10 != 0) {
    iVar11 = -pWVar2->lit;
    if (-1 < pWVar2->weight) {
      iVar11 = pWVar2->lit;
    }
    if (iVar11 < 0) {
      poVar3 = std::operator<<(poVar1," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      uVar10 = uVar10 - 1;
    }
    pWVar2 = pWVar2 + 1;
  }
  iVar9 = uVar8 - uVar6;
  pWVar2 = lits->first;
  iVar11 = iVar9;
  while (iVar11 != 0) {
    iVar4 = -pWVar2->lit;
    if (-1 < pWVar2->weight) {
      iVar4 = pWVar2->lit;
    }
    if (-1 < iVar4) {
      poVar3 = std::operator<<(poVar1," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      iVar11 = iVar11 + -1;
    }
    pWVar2 = pWVar2 + 1;
  }
  if (!card) {
    poVar1 = this->os_;
    pWVar5 = &lits->first->weight;
    while (uVar6 != 0) {
      iVar11 = -((WeightLit_t *)(pWVar5 + -1))->lit;
      if (-1 < *pWVar5) {
        iVar11 = ((WeightLit_t *)(pWVar5 + -1))->lit;
      }
      if (iVar11 < 0) {
        poVar3 = std::operator<<(poVar1," ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        uVar6 = uVar6 - 1;
      }
      pWVar5 = pWVar5 + 2;
    }
    pWVar5 = &lits->first->weight;
    while (iVar9 != 0) {
      iVar11 = -((WeightLit_t *)(pWVar5 + -1))->lit;
      if (-1 < *pWVar5) {
        iVar11 = ((WeightLit_t *)(pWVar5 + -1))->lit;
      }
      if (-1 < iVar11) {
        poVar3 = std::operator<<(poVar1," ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        iVar9 = iVar9 + -1;
      }
      pWVar5 = pWVar5 + 2;
    }
  }
  return this;
}

Assistant:

SmodelsOutput& SmodelsOutput::add(Weight_t bnd, const WeightLitSpan& lits, bool card) {
	unsigned neg = negSize(lits), size = static_cast<unsigned>(Potassco::size(lits));
	if (!card) { add(static_cast<unsigned>(bnd)); }
	add(size).add(neg);
	if (card)  { add(static_cast<unsigned>(bnd)); }
	print(os_, lits, neg, size - neg, Atom());
	if (!card) { print(os_, lits, neg, size - neg, SmWeight()); }
	return *this;
}